

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall QTipLabel::setTipRect(QTipLabel *this,QWidget *w,QRect *r)

{
  int iVar1;
  bool bVar2;
  QMessageLogger *in_RDX;
  long in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  byte bVar3;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRect::isNull(in_RDI);
  bVar3 = 0;
  if (!bVar2) {
    bVar3 = in_RSI != 0 ^ 0xff;
  }
  if ((bVar3 & 1) == 0) {
    in_RDI[4].x1 = (Representation)(int)in_RSI;
    in_RDI[4].y1 = (Representation)(int)((ulong)in_RSI >> 0x20);
    iVar1 = (in_RDX->context).line;
    in_RDI[4].x2 = (Representation)(in_RDX->context).version;
    in_RDI[4].y2 = (Representation)iVar1;
    *(char **)(in_RDI + 5) = (in_RDX->context).file;
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDX,(char *)CONCAT17(bVar3,in_stack_ffffffffffffffb8),(int)((ulong)in_RDI >> 0x20)
               ,in_stack_ffffffffffffffa8);
    QMessageLogger::warning(local_28,"QToolTip::setTipRect: Cannot pass null widget if rect is set")
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::setTipRect(QWidget *w, const QRect &r)
{
    if (Q_UNLIKELY(!r.isNull() && !w)) {
        qWarning("QToolTip::setTipRect: Cannot pass null widget if rect is set");
        return;
    }
    widget = w;
    rect = r;
}